

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

bool __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this,
          ParseHandler<SGParser::Generator::RegExprNFAParseElement> *parseHandler)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ReduceProduction RVar4;
  uint uVar5;
  const_reference pvVar6;
  size_t sVar7;
  size_t streamLength;
  const_reference pvVar8;
  pointer pvVar9;
  uint uVar10;
  ulong uVar11;
  size_t local_c8;
  TokenType local_b8;
  TokenType tmpToken;
  uint j;
  uint nextActionAfterError;
  uint state;
  uint length;
  bool needNextAction;
  ulong uStack_98;
  uint actionVal;
  size_t pos;
  size_t sp;
  size_t i_3;
  size_t maxToken;
  size_t nextStackPosition;
  bool nextActionValid;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_68;
  bool errorProdFound;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_60;
  const_iterator it;
  size_t i_2;
  size_t i_1;
  size_t i;
  ReduceProduction rprod;
  uint ReducedProd;
  size_t offset;
  size_t marker;
  uint actionEntry;
  uint errorCode;
  ParseHandler<SGParser::Generator::RegExprNFAParseElement> *parseHandler_local;
  Parse<SGParser::Generator::RegExprNFAParseElement> *this_local;
  
  _actionEntry = parseHandler;
  parseHandler_local = (ParseHandler<SGParser::Generator::RegExprNFAParseElement> *)this;
LAB_0018f6ae:
  if (this->TopState == 0xffffffff) {
    return false;
  }
  this->pStack[this->StackPosition].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
  State = this->TopState;
  if ((this->NextTokenFlag & 1U) != 0) {
    GetNextToken(this,&this->Token);
  }
  do {
    while( true ) {
      marker._0_4_ = ParseTable::GetAction
                               (this->pParseTable,
                                this->pStack[this->StackPosition].
                                super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                State,(this->Token).super_TokenCode.Code);
      while (((uint)marker & 0x8000) != 0) {
        this->StackPosition = this->StackPosition + 1;
        if (this->StackSize <= this->StackPosition) {
          __assert_fail("StackPosition < StackSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                        ,0x1c8,
                        "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                       );
        }
        this->pStack[this->StackPosition].
        super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State =
             (uint)marker & 0x3fff;
        Generator::RegExprNFAParseElement::ShiftToken
                  (this->pStack + this->StackPosition,&this->Token,
                   &(this->Stream).super_TokenStream<SGParser::Generator::RegExprParseToken>);
        pvVar6 = std::
                 vector<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
                 ::operator[](&this->pParseTable->Terminals,
                              (ulong)(this->Token).super_TokenCode.Code);
        if (((byte)*pvVar6 & 1) != 0) {
          if ((this->Token).super_TokenCode.Code == 0) {
            local_c8 = this->ErrorMarker;
          }
          else {
            local_c8 = this->pStack[this->StackPosition - 1].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                       TerminalMarker;
          }
          sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                            (&this->Stream);
          streamLength = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                         GetBufferedLength(&this->Stream,local_c8);
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                    (&this->Stream,local_c8,streamLength);
          ParseStackElement<SGParser::Generator::RegExprParseToken>::SetErrorData
                    (&this->pStack[this->StackPosition].
                      super_ParseStackElement<SGParser::Generator::RegExprParseToken>,&this->Token,
                     &(this->Stream).super_TokenStream<SGParser::Generator::RegExprParseToken>);
          pvVar8 = std::
                   vector<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                   ::operator[](&this->pParseTable->StateInfos,
                                (ulong)this->pStack[this->StackPosition].
                                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>
                                       .State);
          if (((byte)*pvVar8 >> 1 & 1) == 0) {
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekTo
                      (&this->Stream,sVar7);
          }
          else {
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                      (&this->Stream,
                       this->pStack[this->StackPosition - 1].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                       TerminalMarker,0xffffffffffffffff);
          }
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMaxStreamLength
                    (&this->Stream,0xffffffffffffffff);
        }
        pvVar8 = std::
                 vector<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                 ::operator[](&this->pParseTable->StateInfos,
                              (ulong)this->pStack[this->StackPosition].
                                     super_ParseStackElement<SGParser::Generator::RegExprParseToken>
                                     .State);
        if (((byte)*pvVar8 & 1) == 0) {
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
               0xffffffffffffffff;
        }
        else {
          sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                            (&this->Stream);
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker = sVar7;
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                    (&this->Stream,sVar7);
        }
        GetNextToken(this,&this->Token);
        marker._0_4_ = ParseTable::GetAction
                                 (this->pParseTable,
                                  this->pStack[this->StackPosition].
                                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                  State,(this->Token).super_TokenCode.Code);
      }
      if (((uint)marker & 0x4000) != 0) break;
      marker._4_4_ = 0;
LAB_0018fe4b:
      bVar3 = AdvancedInput(this);
      if ((bVar3) ||
         (sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetBufferedLength
                            (&this->Stream,this->ErrorMarker), sVar7 == 0)) {
        if (this->ErrorMarker != 0xffffffffffffffff) {
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                    (&this->Stream,this->ErrorMarker);
        }
        sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                          (&this->Stream);
        this->ErrorMarker = sVar7 - 1;
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                  (&this->Stream,this->ErrorMarker);
      }
      bVar3 = false;
      bVar2 = false;
      maxToken = 0;
      sVar7 = ParseTable::GetTerminalCount(this->pParseTable);
      std::fill<unsigned_long*,unsigned_long>
                (this->pValidTokenStackPositions,this->pValidTokenStackPositions + sVar7,
                 &InvalidIndex);
      for (sp = 0; sp <= this->StackPosition; sp = sp + 1) {
        uVar11 = this->StackPosition - sp;
        marker._0_4_ = ParseTable::GetAction
                                 (this->pParseTable,
                                  this->pStack[uVar11].
                                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                  State,marker._4_4_);
        if (((uint)marker & 0xc000) != 0) {
          bVar1 = true;
          uStack_98 = uVar11;
          while (length = (uint)marker & 0x3fff, ((uint)marker & 0x4000) != 0) {
            uVar10 = ParseTable::GetReduceActionPopSize(this->pParseTable,length);
            if (uVar10 == 0) {
              bVar1 = false;
              break;
            }
            uStack_98 = uStack_98 - (uVar10 - 1);
            bVar3 = false;
            if (uStack_98 != 0) {
              bVar3 = uStack_98 <= this->StackSize;
            }
            if (!bVar3) {
              __assert_fail("pos > 0u && pos <= StackSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                            ,599,
                            "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                           );
            }
            uVar10 = ParseTable::GetReduceState
                               (this->pParseTable,
                                this->pStack[uStack_98 - 1].
                                super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                State,length);
            if (uVar10 == 0xffffffff) {
              bVar1 = false;
              break;
            }
            marker._0_4_ = ParseTable::GetAction(this->pParseTable,uVar10,marker._4_4_);
          }
          bVar3 = true;
          if ((bVar1) &&
             (tmpToken.ch = ParseTable::GetAction
                                      (this->pParseTable,length,(this->Token).super_TokenCode.Code),
             (tmpToken.ch & 0xc000) != 0)) {
            bVar2 = true;
            maxToken = uVar11;
            break;
          }
          for (tmpToken.super_TokenCode.Code = 0; tmpToken.super_TokenCode.Code < (uint)sVar7;
              tmpToken.super_TokenCode.Code = tmpToken.super_TokenCode.Code + 1) {
            if ((this->pValidTokenStackPositions[tmpToken.super_TokenCode.Code] ==
                 0xffffffffffffffff) &&
               (uVar10 = ParseTable::GetAction
                                   (this->pParseTable,length,tmpToken.super_TokenCode.Code),
               (uVar10 & 0xc000) != 0)) {
              this->pValidTokenStackPositions[tmpToken.super_TokenCode.Code] = uVar11;
            }
          }
        }
      }
      if (!bVar3) {
        this->LastErrorState =
             this->pStack[this->StackPosition].
             super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State;
        PrintStack(this,&this->ErrorStackStr);
LAB_001903d5:
        CleanupParseStack(this,0);
        return false;
      }
      if (bVar2) {
        uVar10 = ParseTable::GetAction
                           (this->pParseTable,
                            this->pStack[this->StackPosition].
                            super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                            marker._4_4_);
        if ((uVar10 & 0x4000) == 0) {
          CleanupParseStack(this,maxToken);
        }
      }
      else {
        if (this->pValidTokenStackPositions[(this->Token).super_TokenCode.Code] !=
            0xffffffffffffffff) {
          __assert_fail("pValidTokenStackPositions[Token.Code] == InvalidIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                        ,0x294,
                        "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                       );
        }
        local_b8 = this->Token;
        do {
          if ((local_b8.super_TokenCode.Code == 1) ||
             ((local_b8.super_TokenCode.Code == 0 &&
              (uVar11 = this->PrevTokenIndex,
              sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                                (&this->Stream), sVar7 <= uVar11)))) goto LAB_001903d5;
          GetNextToken(this,&local_b8);
        } while (this->pValidTokenStackPositions[(ulong)local_b8 & 0xffffffff] == 0xffffffffffffffff
                );
        uVar10 = ParseTable::GetAction
                           (this->pParseTable,
                            this->pStack[this->StackPosition].
                            super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                            marker._4_4_);
        if ((uVar10 & 0x4000) == 0) {
          CleanupParseStack(this,this->pValidTokenStackPositions[(ulong)local_b8 & 0xffffffff]);
        }
      }
      sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                        (&this->Stream);
      this->PrevTokenIndex = sVar7;
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(&this->Stream,1);
      (this->Token).super_TokenCode.Code = marker._4_4_;
    }
    if ((uint)marker == 0x4fff) {
      return true;
    }
    uVar10 = (uint)marker & 0x3fff;
    RVar4 = ParseTable::GetReduceProduction(this->pParseTable,uVar10);
    for (i_1 = 0; i_1 < ((uint)RVar4 & 0xff); i_1 = i_1 + 1) {
      if (this->pStack[this->StackPosition - i_1].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker !=
          0xffffffffffffffff) {
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                  (&this->Stream,
                   this->pStack[this->StackPosition - i_1].
                   super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker);
      }
    }
    this->StackPosition = (this->StackPosition + 1) - (ulong)((uint)RVar4 & 0xff);
    uVar5 = ParseTable::GetLeftReduceState
                      (this->pParseTable,
                       this->pStack[this->StackPosition - 1].
                       super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                       (uint)RVar4 >> 8 & 0x3fffff);
    this->TopState = uVar5;
    if (this->TopState != 0xffffffff) {
      this->NextTokenFlag = false;
      this->ReduceLeft = (uint)RVar4 >> 8 & 0x3fffff;
      if (((uint)RVar4 & 0xff) == 0) {
        pvVar8 = std::
                 vector<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                 ::operator[](&this->pParseTable->StateInfos,(ulong)this->TopState);
        if (((byte)*pvVar8 & 1) == 0) {
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
               0xffffffffffffffff;
        }
        else {
          sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                            (&this->Stream);
          this->pStack[this->StackPosition].
          super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker = sVar7;
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                    (&this->Stream,sVar7);
        }
      }
      if ((((uint)RVar4 >> 0x1e & 1) == 0) &&
         (uVar5 = (*_actionEntry->_vptr_ParseHandler[2])(_actionEntry,this,(ulong)uVar10),
         (uVar5 & 1) == 0)) goto LAB_001903d5;
      it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._0_4_
           = (uint)RVar4 & 0xff;
      it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_
           = 0;
      for (; it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
             != (__node_type *)0x0;
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               ((long)it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + -1)) {
        ParseStackElement<SGParser::Generator::RegExprParseToken>::Cleanup
                  (&this->pStack
                    [this->StackPosition +
                     (long)it.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur].super_ParseStackElement<SGParser::Generator::RegExprParseToken>)
        ;
      }
      if ((int)RVar4 < 0) {
        marker._4_4_ = uVar10 | this->ReduceLeft << 0x10;
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find(&this->pParseTable->ProductionErrorTerminals,(key_type *)((long)&marker + 4));
        _Stack_68._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end(&this->pParseTable->ProductionErrorTerminals);
        bVar3 = std::__detail::operator!=(&local_60,&stack0xffffffffffffff98);
        if (bVar3) {
          pvVar9 = std::__detail::
                   _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_60);
          marker._4_4_ = pvVar9->second & 0xfffffff;
          goto LAB_0018fe4b;
        }
      }
      goto LAB_0018f6ae;
    }
    for (i_2 = (size_t)(((uint)RVar4 & 0xff) + 1); i_2 != 0; i_2 = i_2 - 1) {
      ParseStackElement<SGParser::Generator::RegExprParseToken>::Cleanup
                (&this->pStack[this->StackPosition + i_2 + -1].
                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>);
    }
    if (this->StackPosition == 0) {
      __assert_fail("StackPosition > 0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                    ,0x202,
                    "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                   );
    }
    this->StackPosition = this->StackPosition - 1;
    (this->Token).super_TokenCode.Code = 0;
    sVar7 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex
                      (&this->Stream);
    this->PrevTokenIndex = sVar7;
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(&this->Stream,1);
  } while( true );
}

Assistant:

bool Parse<StackElement>::DoParse(ParseHandler<StackElement>& parseHandler) {
    unsigned errorCode;

    // Continue to parse until we encounter an error or accept
    while (true) {
        // Check the top state to make sure it is valid
        if (TopState == InvalidState)
            return false;

        // Store result from the previous step
        pStack[StackPosition].State = TopState;

        // Get the token code if needed
        if (NextTokenFlag)
            GetNextToken(Token);

    try_next_action:
        // Keep shifting as long as 'Shift' action is selected
        auto actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        while (actionEntry & ParseTable::ShiftMask) {
            ++StackPosition;
            SG_ASSERT(StackPosition < StackSize);
            pStack[StackPosition].State = actionEntry & ParseTable::ExtractMask;

            // User callback (to get at token data)
            pStack[StackPosition].ShiftToken(Token, Stream);
            if (pParseTable->Terminals[Token.Code].ErrorTerminal) {
                const auto marker = Token.Code == TokenCode::TokenError
                                        ? ErrorMarker
                                        : pStack[StackPosition - 1u].TerminalMarker;
                const auto offset = Stream.GetTokenIndex();
                Stream.BacktrackToMarker(marker, Stream.GetBufferedLength(marker));
                pStack[StackPosition].SetErrorData(Token, Stream);
                // If it's a backtracking error, backtrack & retry the whole thing
                if (pParseTable->StateInfos[pStack[StackPosition].State].BacktrackOnError)
                    Stream.BacktrackToMarker(pStack[StackPosition - 1u].TerminalMarker);
                else
                    Stream.SeekTo(offset);
                Stream.SetMaxStreamLength();
            }

            // Start recording if needed
            if (pParseTable->StateInfos[pStack[StackPosition].State].Record)
                Stream.SetMarker(pStack[StackPosition].TerminalMarker = Stream.GetTokenIndex());
            else
                pStack[StackPosition].TerminalMarker = InvalidIndex;

            // Get next token
            GetNextToken(Token);
            // And get next action
            actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        }

        // Do Reduce
        if (actionEntry & ParseTable::ReduceMask) {
            // See if we have accepted
            if (actionEntry == ParseTable::AcceptValue)
                return true;

            // On reduce, this is the production Id
            const auto ReducedProd = actionEntry & ParseTable::ExtractMask;
            const auto rprod       = pParseTable->GetReduceProduction(ReducedProd);

            // Release all markers
            for (size_t i = 0u; i < size_t(rprod.Length); ++i)
                if (pStack[StackPosition - i].TerminalMarker != InvalidIndex)
                    Stream.ReleaseMarker(pStack[StackPosition - i].TerminalMarker);

            // Pop the production (size-1), (point to the top element
            // so it can be accessed with [])
            StackPosition = StackPosition + 1u - size_t(rprod.Length);
            // Get next state (consult goto)
            TopState      = pParseTable->GetLeftReduceState(pStack[StackPosition - 1u].State,
                                                            rprod.Left);
            if (TopState == InvalidState) {
                // Cleanup the stack, including [StackPosition].
                for (size_t i = size_t(rprod.Length + 1u); i > 0u; --i)
                    pStack[StackPosition + i - 1u].Cleanup();
                // Revert to previous stack position.
                SG_ASSERT(StackPosition > 0u);
                --StackPosition;
                // Set Token.Code to '%error', which will allow try_next_action to process
                // appropriately, with either shift or reduce.
                Token.Code     = TokenCode::TokenError;
                // Backtrack by one token so that the first valid token can be re-consumed
                // properly following an error.
                PrevTokenIndex = Stream.GetTokenIndex();
                Stream.SeekBack(1u);
                goto try_next_action;
            }
            NextTokenFlag = false;
            ReduceLeft    = rprod.Left;

            // If the Stack Position advanced we must make sure to set the terminal marker
            if (rprod.Length == 0u) {
                // Start recording if needed
                if (pParseTable->StateInfos[TopState].Record)
                    Stream.SetMarker(pStack[StackPosition].TerminalMarker =
                        Stream.GetTokenIndex());
                else
                    pStack[StackPosition].TerminalMarker = InvalidIndex;
            }

            // If the reduce function fails than return an error
            if (!rprod.NotReported && !parseHandler.Reduce(*this, ReducedProd))
                goto step_error;

            // Cleanup the stack after [StackPosition].
            // Leave the element at stack position unchanged since it holds the Reduce result.
            for (size_t i = size_t(rprod.Length); i > 0u; --i)
                pStack[StackPosition + i].Cleanup();

            // See if this production has to throw a named error
            if (rprod.ErrorTerminalFlag) {
                errorCode = ReducedProd | (ReduceLeft << 16u);
                if (const auto it = pParseTable->ProductionErrorTerminals.find(errorCode);
                    it != pParseTable->ProductionErrorTerminals.end()) {
                    errorCode = it->second;
                    errorCode &= ProductionMask::TerminalValue;
                    goto handle_error;
                }
            }
            continue;
        }

        // An Error has occurred, deal with it
        errorCode = TokenCode::TokenError;

    handle_error:
        // Note that if we haven't advanced input, it's the same error as before
        if (AdvancedInput() || Stream.GetBufferedLength(ErrorMarker) == 0u) {
            if (ErrorMarker != InvalidIndex)
                Stream.ReleaseMarker(ErrorMarker);
            ErrorMarker = Stream.GetTokenIndex() - 1u;
            Stream.SetMarker(ErrorMarker);
        }

        // Calculate valid token set
        bool       errorProdFound    = false;
        bool       nextActionValid   = false;
        size_t     nextStackPosition = 0u;
        const auto maxToken          = pParseTable->GetTerminalCount();
        std::fill(pValidTokenStackPositions, pValidTokenStackPositions + maxToken, InvalidIndex);

        // Search stack until a state with action on 'error' is found
        for (size_t i = 0u; i <= StackPosition; ++i) {
            const auto sp = StackPosition - i;
            actionEntry   = pParseTable->GetAction(pStack[sp].State, errorCode);
            if (actionEntry & (ParseTable::ShiftMask | ParseTable::ReduceMask)) {
                // If the action is reduce, we have to try reducing until we
                // finally shift the error token
                // Once we shift, we can look for the next valid token
                auto pos            = sp;
                auto actionVal      = actionEntry & ParseTable::ExtractMask;
                bool needNextAction = true;

                while (actionEntry & ParseTable::ReduceMask) {
                    // Check special case (Accept)
                    const auto length = pParseTable->GetReduceActionPopSize(actionVal);
                    if (length == 0u) {
                        needNextAction = false;
                        break;
                    }
                    pos -= length - 1u;
                    SG_ASSERT(pos > 0u && pos <= StackSize);
                    // Check special case (reduce state for action is invalid)
                    const auto state = pParseTable->GetReduceState(pStack[pos - 1u].State, actionVal);
                    if (state == InvalidState) {
                        needNextAction = false;
                        break;
                    }
                    actionEntry = pParseTable->GetAction(state, errorCode);
                    actionVal   = actionEntry & ParseTable::ExtractMask;
                }

                // We should be shifting next, so actionVal is a state that'll be
                // on stack once we shift error
                errorProdFound = true;

                if (needNextAction) {
                    const auto nextActionAfterError = pParseTable->GetAction(actionVal, Token.Code);
                    if ((nextActionAfterError & (ParseTable::ShiftMask | ParseTable::ReduceMask)) != 0) {
                        nextActionValid   = true;
                        nextStackPosition = sp;
                        break;
                    }
                }

                // Go through all symbols, and collect allowed tokens
                for (unsigned j = 0u; j < unsigned(maxToken); ++j)
                    if (pValidTokenStackPositions[j] == InvalidIndex)
                        if (pParseTable->GetAction(actionVal, j) & ParseTable::ActionMask)
                            pValidTokenStackPositions[j]  = sp;
            }
        }

        if (!errorProdFound) {
            LastErrorState = pStack[StackPosition].State;
            PrintStack(ErrorStackStr);
            goto step_error;
        }

        if (nextActionValid) {
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(nextStackPosition);
            }
        } else {
            // If an error production was found up the stack, we try to recover. This involves:
            //  1. Skipping all tokens, potentially including the last token that triggered the error,
            //     until a valid token is found.
            //       - No tokens may be skipped at all if the offending token is actually valid directly
            //         after an error. If you wrote "(5 + )" instead of "(5 + 5)" your original error
            //         token may be ')' but it doesn't actually need to be skipped.
            //         In this case, pValidTokenStackPositions[Token.Code] is valid up the stack, so no skipping
            //         takes place.
            //  2. Rolling back the stack, which includes StackPosition to a state that accepts
            //     an error followed by our next token. This is done by
            //         CleanupParseStack(pValidTokenStackPositions[Token.Code])
            //  3. Backtracking by one token and setting Token.Code to 'errorCode' to continue parsing.
            //         This will cause '%error' to be shifted onto the stack and allow things
            //         to move on with the next valid token after it.
            // (1.) Skip all 'unacceptable' tokens until a valid token, if any.
            SG_ASSERT(pValidTokenStackPositions[Token.Code] == InvalidIndex);
            TokenType tmpToken = Token;
            do {
                if (tmpToken.Code == TokenCode::TokenEOF) {
                    // If EOF was not in a valid look-ahead following %error, and we have hit
                    // the end of file, there is nothing left to do.
                    goto step_error;
                }
                if (tmpToken.Code == TokenCode::TokenError) {
                    // There are two reasons we can end up here:
                    //   a) Tokenizer generated TokenError because it saw unexpected characters,
                    //      which it had no reg-exp for. If this is the case, just skip them.
                    //   b) This is a second time through the error-handling loop for the same token.
                    //      We've already set Token.Code = errorCode for this token and tried
                    //      to recover, but for some reason this didn't work and we are back here.
                    //      Fail if this is the case.
                    if (PrevTokenIndex >= Stream.GetTokenIndex())
                        goto step_error;
                }
                GetNextToken(tmpToken);
            } while (pValidTokenStackPositions[tmpToken.Code] == InvalidIndex);
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // (2.) Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(pValidTokenStackPositions[tmpToken.Code]);
            }
        }
        // Set Token.Code to '%error', which will allow try_next_action to process appropriately,
        // with either shift or reduce. Also backtrack by one token so that the first valid token
        // can be re-consumed properly following an error.
        PrevTokenIndex = Stream.GetTokenIndex();
        Stream.SeekBack(1u);
        Token.Code = errorCode;
        goto try_next_action;
    }

step_error:
    // Clean up the parse stack by freeing all the elements
    CleanupParseStack();
    return false;
}